

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

void agc_emax_update(agc_t *agc)

{
  int iVar1;
  float fVar2;
  
  if (agc->obs_frame != 0) {
    fVar2 = (float)agc->obs_max + (float)agc->obs_max_sum;
    agc->obs_max_sum = (mfcc_t)fVar2;
    iVar1 = agc->obs_utt + 1;
    agc->obs_utt = iVar1;
    agc->max = (mfcc_t)(fVar2 / (float)iVar1);
    if (iVar1 == 0x10) {
      agc->obs_max_sum = (mfcc_t)(fVar2 * 0.5);
      agc->obs_utt = 8;
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
          ,0xac,"AGCEMax: obs= %.2f, new= %.2f\n",(double)(float)agc->obs_max,
          (double)(float)agc->max);
  agc->obs_max = -1000.0;
  agc->obs_frame = 0;
  return;
}

Assistant:

void
agc_emax_update(agc_t *agc)
{
    if (agc->obs_frame) {            /* Update only if some data observed */
        agc->obs_max_sum += agc->obs_max;
        agc->obs_utt++;

        /* Re-estimate max over past history; decay the history */
        agc->max = agc->obs_max_sum / agc->obs_utt;
        if (agc->obs_utt == 16) {
            agc->obs_max_sum /= 2;
            agc->obs_utt = 8;
        }
    }
    E_INFO("AGCEMax: obs= %.2f, new= %.2f\n", agc->obs_max, agc->max);

    /* Reset the accumulators for the next utterance. */
    agc->obs_frame = 0;
    agc->obs_max = FLOAT2MFCC(-1000.0); /* Less than any real C0 value (hopefully!!) */
}